

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t base64_decode(char *in,size_t inlen,uchar *out)

{
  byte bVar1;
  uchar c;
  size_t i;
  size_t ignored;
  size_t j;
  uchar *out_local;
  size_t inlen_local;
  char *in_local;
  
  j = 0;
  ignored = 0;
  for (i = 0; (i < inlen && (in[i] != '=')); i = i + 1) {
    if ((in[i] == '\n') || (((in[i] == '\r' || (in[i] == '\t')) || (in[i] == ' ')))) {
      ignored = ignored + 1;
    }
    else {
      bVar1 = base64de[(byte)in[i]];
      if (bVar1 == 0xff) {
        return 0;
      }
      switch((int)i - (int)ignored & 3) {
      case 0:
        out[j] = bVar1 << 2;
        break;
      case 1:
        out[j] = out[j] | (byte)((int)(uint)bVar1 >> 4) & 3;
        out[j + 1] = bVar1 << 4;
        j = j + 1;
        break;
      case 2:
        out[j] = out[j] | (byte)((int)(uint)bVar1 >> 2) & 0xf;
        out[j + 1] = bVar1 << 6;
        j = j + 1;
        break;
      case 3:
        out[j] = out[j] | bVar1;
        j = j + 1;
      }
    }
  }
  return j;
}

Assistant:

size_t base64_decode(const char* in, size_t inlen, unsigned char* out)
{
	size_t j = 0;
	size_t ignored = 0;

	for (size_t i = 0; i < inlen; i++)
	{
		if (in[i] == BASE64_PAD)
			break;

		if (in[i] == '\n' || in[i] == '\r' || in[i] == '\t' || in[i] == ' ')
		{
			ignored++;
			continue;
		}

		unsigned char c = base64de[(unsigned char)in[i]];

		if (c == 255)
			return 0;

		switch((i - ignored) & 0x3)
		{
			case 0:
				out[j] = (c << 2) & 0xFF;
				break;
			case 1:
				out[j++] |= (c >> 4) & 0x3;
				out[j] = (c & 0xF) << 4; 
				break;
			case 2:
				out[j++] |= (c >> 2) & 0xF;
				out[j] = (c & 0x3) << 6;
				break;
			case 3:
				out[j++] |= c;
				break;
		}
	}

	return j;
}